

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *file,
          Options *options)

{
  string_view pc;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  size_type sVar2;
  FileOptions *pFVar3;
  string *this_00;
  char *pcVar4;
  FileDescriptor *in_R8;
  AlphaNum *in_R9;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  undefined1 auVar6 [16];
  string_view name;
  string_view classname;
  string_view name_00;
  string_view classname_00;
  AlphaNum local_418;
  AlphaNum local_3e8;
  undefined1 local_3b8 [16];
  string local_3a8;
  AlphaNum local_388;
  AlphaNum local_358;
  basic_string_view<char,_std::char_traits<char>_> local_328;
  string local_318;
  int local_2f4;
  undefined1 local_2f0 [4];
  int file_name_start;
  AlphaNum local_2c0;
  undefined1 local_290 [16];
  string local_280;
  AlphaNum local_260;
  basic_string_view<char,_std::char_traits<char>_> local_230;
  string local_220;
  AlphaNum local_200;
  AlphaNum local_1d0;
  char local_19a [2];
  char *local_198;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  size_t local_188;
  size_t sStack_180;
  AlphaNum local_178;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_148;
  size_t local_138;
  char *local_130;
  undefined1 auStack_128 [8];
  string_view php_metadata_namespace;
  allocator<char> local_101;
  size_t local_100;
  char *local_f8;
  size_t local_f0;
  size_t local_e8;
  int local_dc;
  undefined1 auStack_d8 [4];
  int lastindex;
  string_view file_no_suffix;
  allocator<char> local_b9;
  size_t local_b8;
  char *local_b0;
  size_t local_a8;
  size_t local_a0;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string segment;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string result;
  int first_index;
  int start_index;
  string_view proto_file;
  Options *options_local;
  FileDescriptor *file_local;
  
  proto_file._M_str = (char *)file;
  _first_index = FileDescriptor::name((FileDescriptor *)this);
  result.field_2._12_4_ = 0;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)&first_index,'/',0);
  result.field_2._8_4_ = (undefined4)sVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,anon_var_dwarf_37cdd0 + 5,&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,anon_var_dwarf_37cdd0 + 5,&local_91);
  std::allocator<char>::~allocator(&local_91);
  local_a8 = _first_index;
  local_a0 = proto_file._M_len;
  local_b8 = 0x1b;
  local_b0 = "google/protobuf/empty.proto";
  bVar5._M_str = "google/protobuf/empty.proto";
  bVar5._M_len = 0x1b;
  bVar1 = std::operator==(_first_index,bVar5);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&kEmptyMetadataFile,&local_b9);
    std::allocator<char>::~allocator(&local_b9);
  }
  else if ((*proto_file._M_str & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_d8);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)&first_index,'.',
                       0xffffffffffffffff);
    local_dc = (int)sVar2;
    local_f0 = _first_index;
    local_e8 = proto_file._M_len;
    local_100 = 0x1b;
    local_f8 = "google/protobuf/empty.proto";
    __y._M_str = "google/protobuf/empty.proto";
    __y._M_len = 0x1b;
    bVar1 = std::operator==(_first_index,__y);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&kEmptyMetadataFile,&local_101);
      std::allocator<char>::~allocator(&local_101);
    }
    else {
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&first_index,0,
                         (long)local_dc);
      file_no_suffix._M_len = (size_t)bVar5._M_str;
      php_metadata_namespace._M_str = (char *)bVar5._M_len;
      _auStack_d8 = php_metadata_namespace._M_str;
      pFVar3 = FileDescriptor::options((FileDescriptor *)this);
      bVar1 = FileOptions::has_php_metadata_namespace(pFVar3);
      if (bVar1) {
        pFVar3 = FileDescriptor::options((FileDescriptor *)this);
        this_00 = FileOptions::php_metadata_namespace_abi_cxx11_(pFVar3);
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
        php_metadata_namespace._M_len = auVar6._8_8_;
        auStack_128 = auVar6._0_8_;
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_128);
        if (!bVar1) {
          local_138 = (size_t)auStack_128;
          local_130 = (char *)php_metadata_namespace._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"\\");
          __x._M_str = local_130;
          __x._M_len = local_138;
          bVar1 = std::operator!=(__x,local_148);
          if (bVar1) {
            local_188 = (size_t)auStack_128;
            sStack_180 = php_metadata_namespace._M_len;
            pc._M_str = (char *)php_metadata_namespace._M_len;
            pc._M_len = (size_t)auStack_128;
            absl::lts_20250127::AlphaNum::AlphaNum(&local_178,pc);
            absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_58,&local_178);
            local_190._M_current = (char *)std::__cxx11::string::begin();
            local_198 = (char *)std::__cxx11::string::end();
            local_19a[1] = 0x5c;
            local_19a[0] = '/';
            std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      (local_190,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_198,local_19a + 1,local_19a);
            std::__cxx11::string::size();
            pcVar4 = (char *)std::__cxx11::string::at((ulong)local_58);
            if (*pcVar4 != '/') {
              absl::lts_20250127::AlphaNum::AlphaNum(&local_1d0,"/");
              absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_58,&local_1d0);
            }
          }
        }
      }
      else {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_200,"GPBMetadata/");
        absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_58,&local_200);
        while (result.field_2._8_4_ != -1) {
          bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_d8,
                             (long)(int)result.field_2._12_4_,
                             (long)(int)(result.field_2._8_4_ - result.field_2._12_4_));
          name._M_len = bVar5._M_str;
          name._M_str = (char *)0x1;
          local_230 = bVar5;
          UnderscoresToCamelCase_abi_cxx11_
                    (&local_220,(_anonymous_namespace_ *)bVar5._M_len,name,SUB81(in_R8,0));
          std::__cxx11::string::operator=((string *)local_90,(string *)&local_220);
          std::__cxx11::string::~string((string *)&local_220);
          auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
          classname._M_len = auVar6._8_8_;
          classname._M_str = (char *)this;
          local_290 = auVar6;
          ReservedNamePrefix_abi_cxx11_(&local_280,auVar6._0_8_,classname,in_R8);
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_260,&local_280);
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                    (&local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
          absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_2f0,"/");
          absl::lts_20250127::StrAppend
                    ((Nonnull<std::string_*>)local_58,&local_260,&local_2c0,(AlphaNum *)local_2f0);
          std::__cxx11::string::~string((string *)&local_280);
          result.field_2._12_4_ = result.field_2._8_4_ + 1;
          sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_d8,'/',
                             (long)(int)result.field_2._12_4_);
          result.field_2._8_4_ = (undefined4)sVar2;
        }
      }
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_d8,'/',
                         0xffffffffffffffff);
      if ((int)sVar2 == -1) {
        local_2f4 = 0;
      }
      else {
        local_2f4 = (int)sVar2 + 1;
      }
      local_328 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_d8,
                             (long)local_2f4,(long)(result.field_2._8_4_ - local_2f4));
      name_00._M_len = local_328._M_str;
      name_00._M_str = (char *)0x1;
      UnderscoresToCamelCase_abi_cxx11_
                (&local_318,(_anonymous_namespace_ *)local_328._M_len,name_00,SUB81(in_R8,0));
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      local_3b8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
      classname_00._M_len = local_3b8._8_8_;
      classname_00._M_str = (char *)this;
      ReservedNamePrefix_abi_cxx11_(&local_3a8,local_3b8._0_8_,classname_00,in_R8);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_388,&local_3a8);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_3e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_418,".php");
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_358,&local_388,&local_3e8,&local_418,
                 in_R9);
      std::__cxx11::string::~string((string *)&local_3a8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&kDescriptorMetadataFile,
               (allocator<char> *)((long)&file_no_suffix._M_str + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&file_no_suffix._M_str + 7));
  }
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMetadataFileName(const FileDescriptor* file,
                                      const Options& options) {
  absl::string_view proto_file = file->name();
  int start_index = 0;
  int first_index = proto_file.find_first_of('/', start_index);
  std::string result = "";
  std::string segment = "";

  if (proto_file == kEmptyFile) {
    return std::string(kEmptyMetadataFile);
  }
  if (options.is_descriptor) {
    return std::string(kDescriptorMetadataFile);
  }

  // Append directory name.
  absl::string_view file_no_suffix;
  int lastindex = proto_file.find_last_of('.');
  if (proto_file == kEmptyFile) {
    return std::string(kEmptyMetadataFile);
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  if (file->options().has_php_metadata_namespace()) {
    absl::string_view php_metadata_namespace =
        file->options().php_metadata_namespace();
    if (!php_metadata_namespace.empty() && php_metadata_namespace != "\\") {
      absl::StrAppend(&result, php_metadata_namespace);
      std::replace(result.begin(), result.end(), '\\', '/');
      if (result.at(result.size() - 1) != '/') {
        absl::StrAppend(&result, "/");
      }
    }
  } else {
    absl::StrAppend(&result, "GPBMetadata/");
    while (first_index != std::string::npos) {
      segment = UnderscoresToCamelCase(
          file_no_suffix.substr(start_index, first_index - start_index), true);
      absl::StrAppend(&result, ReservedNamePrefix(segment, file), segment, "/");
      start_index = first_index + 1;
      first_index = file_no_suffix.find_first_of('/', start_index);
    }
  }

  // Append file name.
  int file_name_start = file_no_suffix.find_last_of('/');
  if (file_name_start == std::string::npos) {
    file_name_start = 0;
  } else {
    file_name_start += 1;
  }
  segment = UnderscoresToCamelCase(
      file_no_suffix.substr(file_name_start, first_index - file_name_start),
      true);

  return absl::StrCat(result, ReservedNamePrefix(segment, file), segment,
                      ".php");
}